

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall Server::~Server(Server *this)

{
  ~Server(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

Server::~Server()
{
	UTIL_FOREACH(this->clients, client)
	{
#ifdef WIN32
		closesocket(client->impl->sock);
#else // WIN32
		close(client->impl->sock);
#endif // WIN32
		delete client;
	}

#ifdef WIN32
	closesocket(this->impl->sock);
#else // WIN32
	close(this->impl->sock);
#endif // WIN32

	delete this->impl;
}